

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

bool Js::InterpreterStackFrame::IsDelayDynamicInterpreterThunk(JavascriptMethod entryPoint)

{
  bool local_11;
  JavascriptMethod entryPoint_local;
  
  local_11 = entryPoint == DelayDynamicInterpreterThunk ||
             entryPoint == AsmJsDelayDynamicInterpreterThunk;
  return local_11;
}

Assistant:

bool InterpreterStackFrame::IsDelayDynamicInterpreterThunk(JavascriptMethod entryPoint)
    {
        return false
#if DYNAMIC_INTERPRETER_THUNK
            || entryPoint == InterpreterStackFrame::DelayDynamicInterpreterThunk
#ifdef ASMJS_PLAT
            || entryPoint == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk
#endif
#endif
            ;
    }